

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

LOs __thiscall
Omega_h::find_unique(Omega_h *this,LOs *hv2v,Omega_h_Family family,Int high_dim,Int low_dim)

{
  Alloc *pAVar1;
  ulong uVar2;
  int iVar3;
  undefined8 uVar4;
  void *extraout_RDX;
  Int deg;
  char *pcVar5;
  LOs LVar6;
  ScopedTimer omega_h_scoped_function_timer;
  ScopedTimer omega_h_scoped_function_timer_1;
  Read<int> uv2v_canon;
  Write<int> local_198;
  Write<signed_char> local_188;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  Read<signed_char> codes;
  LOs sorted2u;
  Write<int> local_108;
  LOs uv2v;
  Write<int> local_e8;
  Write<int> local_d8;
  Write<int> local_c8;
  Write<int> local_b8;
  Write<int> local_a8;
  LOs e2u;
  Write<signed_char> local_88;
  LOs e2sorted;
  Write<int> local_68;
  Write<int> local_58;
  Read<signed_char> jumps;
  Write<int> local_38;
  
  std::__cxx11::string::string
            ((string *)&uv2v_canon,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_188);
  std::operator+(&local_158,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uv2v_canon,
                 ":");
  std::__cxx11::to_string(&local_178,0x92);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&codes,
                 &local_158,&local_178);
  begin_code("find_unique",(char *)codes.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&codes);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&uv2v_canon);
  if (low_dim < high_dim) {
    if (low_dim < 3) {
      pAVar1 = (hv2v->write_).shared_alloc_.alloc;
      if (((ulong)pAVar1 & 1) == 0) {
        uVar2 = pAVar1->size;
      }
      else {
        uVar2 = (ulong)pAVar1 >> 3;
      }
      if (family == OMEGA_H_SIMPLEX) {
        iVar3 = -1;
        if ((uint)high_dim < 4) {
          iVar3 = high_dim + 1;
        }
      }
      else if ((uint)high_dim < 4) {
        iVar3 = *(int *)(&DAT_00377770 + (ulong)(uint)high_dim * 4);
      }
      else {
        iVar3 = -1;
      }
      if ((int)((long)((ulong)(uint)((int)(uVar2 >> 2) >> 0x1f) << 0x20 | uVar2 >> 2 & 0xffffffff) %
               (long)iVar3) == 0) {
        Write<int>::Write(&local_108,&hv2v->write_);
        form_uses((Omega_h *)&uv2v,(LOs *)&local_108,family,high_dim,low_dim);
        Write<int>::~Write(&local_108);
        if (family == OMEGA_H_SIMPLEX) {
          deg = -1;
          if ((uint)low_dim < 3) {
            deg = low_dim + 1;
          }
        }
        else if ((uint)low_dim < 3) {
          deg = *(Int *)(&DAT_0037770c + (ulong)(uint)low_dim * 4);
        }
        else {
          deg = -1;
        }
        Write<int>::Write(&local_198,&uv2v.write_);
        std::__cxx11::string::string
                  ((string *)&uv2v_canon,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
                   ,(allocator *)&local_188);
        std::operator+(&local_158,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &uv2v_canon,":");
        std::__cxx11::to_string(&local_178,0x86);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&codes,
                       &local_158,&local_178);
        begin_code("find_unique_deg",(char *)codes.write_.shared_alloc_.alloc);
        std::__cxx11::string::~string((string *)&codes);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&uv2v_canon);
        Write<int>::Write((Write<int> *)&local_158,&local_198);
        get_codes_to_canonical<int>((Omega_h *)&codes,deg,(Read<int> *)&local_158);
        Write<int>::~Write((Write<int> *)&local_158);
        Write<int>::Write((Write<int> *)&local_178,&local_198);
        Write<signed_char>::Write(&local_188,&codes.write_);
        align_ev2v<int>((Omega_h *)&uv2v_canon,deg,(Read<int> *)&local_178,
                        (Read<signed_char> *)&local_188);
        Write<signed_char>::~Write(&local_188);
        Write<int>::~Write((Write<int> *)&local_178);
        Write<int>::Write(&local_38,&uv2v_canon.write_);
        sort_by_keys<int>((Omega_h *)&sorted2u,(Read<int> *)&local_38,deg);
        Write<int>::~Write(&local_38);
        Write<int>::Write(&local_58,&uv2v_canon.write_);
        Write<int>::Write(&local_68,&sorted2u.write_);
        find_canonical_jumps((Omega_h *)&jumps,deg,(LOs *)&local_58,(LOs *)&local_68);
        Write<int>::~Write(&local_68);
        Write<int>::~Write(&local_58);
        Write<signed_char>::Write(&local_88,&jumps.write_);
        collect_marked((Omega_h *)&e2sorted,(Read<signed_char> *)&local_88);
        Write<signed_char>::~Write(&local_88);
        Write<int>::Write(&local_a8,&e2sorted.write_);
        Write<int>::Write(&local_b8,&sorted2u.write_);
        compound_maps((Omega_h *)&e2u,(LOs *)&local_a8,(LOs *)&local_b8);
        Write<int>::~Write(&local_b8);
        Write<int>::~Write(&local_a8);
        Write<int>::Write(&local_d8,&e2u.write_);
        Write<int>::Write(&local_e8,&local_198);
        unmap<int>((Omega_h *)&local_c8,(LOs *)&local_d8,(Read<int> *)&local_e8,deg);
        Read<int>::Read((Read<signed_char> *)this,&local_c8);
        Write<int>::~Write(&local_c8);
        Write<int>::~Write(&local_e8);
        Write<int>::~Write(&local_d8);
        Write<int>::~Write(&e2u.write_);
        Write<int>::~Write(&e2sorted.write_);
        Write<signed_char>::~Write(&jumps.write_);
        Write<int>::~Write(&sorted2u.write_);
        Write<int>::~Write(&uv2v_canon.write_);
        Write<signed_char>::~Write(&codes.write_);
        ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer_1);
        Write<int>::~Write(&local_198);
        Write<int>::~Write(&uv2v.write_);
        ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
        LVar6.write_.shared_alloc_.direct_ptr = extraout_RDX;
        LVar6.write_.shared_alloc_.alloc = (Alloc *)this;
        return (LOs)LVar6.write_.shared_alloc_;
      }
      uVar4 = 0x95;
      pcVar5 = "hv2v.size() % element_degree(family, high_dim, VERT) == 0";
    }
    else {
      uVar4 = 0x94;
      pcVar5 = "low_dim <= 2";
    }
  }
  else {
    uVar4 = 0x93;
    pcVar5 = "high_dim > low_dim";
  }
  fail("assertion %s failed at %s +%d\n",pcVar5,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
       ,uVar4);
}

Assistant:

LOs find_unique(LOs const hv2v, Omega_h_Family const family, Int const high_dim,
    Int const low_dim) {
  OMEGA_H_TIME_FUNCTION;
  OMEGA_H_CHECK(high_dim > low_dim);
  OMEGA_H_CHECK(low_dim <= 2);
  OMEGA_H_CHECK(hv2v.size() % element_degree(family, high_dim, VERT) == 0);
  auto const uv2v = form_uses(hv2v, family, high_dim, low_dim);
  auto const deg = element_degree(family, low_dim, VERT);
  return find_unique_deg(deg, uv2v);
}